

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall
soplex::SPxSteepPR<double>::load(SPxSteepPR<double> *this,SPxSolverBase<double> *base)

{
  (this->super_SPxPricer<double>).thesolver = base;
  if (base != (SPxSolverBase<double> *)0x0) {
    SSVectorBase<double>::clear(&this->workVec);
    SSVectorBase<double>::reDim(&this->workVec,(base->thecovectors->set).thenum);
    SSVectorBase<double>::clear(&this->workRhs);
    SSVectorBase<double>::reDim(&this->workRhs,(base->thecovectors->set).thenum);
    return;
  }
  return;
}

Assistant:

void SPxSteepPR<R>::load(SPxSolverBase<R>* base)
{
   this->thesolver = base;

   if(base)
   {
      workVec.clear();
      workVec.reDim(base->dim());
      workRhs.clear();
      workRhs.reDim(base->dim());
   }
}